

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool parse_view_position(element_t *element,int id,view_position_t *position)

{
  _Bool _Var1;
  char *end_00;
  char *end;
  char *it;
  string_t *value;
  view_position_t *position_local;
  element_t *peStack_18;
  int id_local;
  element_t *element_local;
  
  value = (string_t *)position;
  position_local._4_4_ = id;
  peStack_18 = element;
  it = (char *)find_attribute(element,id,false);
  if ((string_t *)it == (string_t *)0x0) {
    element_local._7_1_ = false;
  }
  else {
    end = ((string_t *)it)->data;
    end_00 = end + ((string_t *)it)->length;
    _Var1 = skip_string(&end,end_00,"none");
    if (_Var1) {
      *(undefined4 *)&value->data = 0;
    }
    else {
      _Var1 = skip_string(&end,end_00,"xMinYMin");
      if (_Var1) {
        *(undefined4 *)&value->data = 1;
      }
      else {
        _Var1 = skip_string(&end,end_00,"xMidYMin");
        if (_Var1) {
          *(undefined4 *)&value->data = 2;
        }
        else {
          _Var1 = skip_string(&end,end_00,"xMaxYMin");
          if (_Var1) {
            *(undefined4 *)&value->data = 3;
          }
          else {
            _Var1 = skip_string(&end,end_00,"xMinYMid");
            if (_Var1) {
              *(undefined4 *)&value->data = 4;
            }
            else {
              _Var1 = skip_string(&end,end_00,"xMidYMid");
              if (_Var1) {
                *(undefined4 *)&value->data = 5;
              }
              else {
                _Var1 = skip_string(&end,end_00,"xMaxYMid");
                if (_Var1) {
                  *(undefined4 *)&value->data = 6;
                }
                else {
                  _Var1 = skip_string(&end,end_00,"xMinYMax");
                  if (_Var1) {
                    *(undefined4 *)&value->data = 7;
                  }
                  else {
                    _Var1 = skip_string(&end,end_00,"xMidYMax");
                    if (_Var1) {
                      *(undefined4 *)&value->data = 8;
                    }
                    else {
                      _Var1 = skip_string(&end,end_00,"xMaxYMax");
                      if (!_Var1) {
                        return false;
                      }
                      *(undefined4 *)&value->data = 9;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    *(undefined4 *)((long)&value->data + 4) = 0;
    if (*(int *)&value->data != 0) {
      skip_ws(&end,end_00);
      _Var1 = skip_string(&end,end_00,"meet");
      if (_Var1) {
        *(undefined4 *)((long)&value->data + 4) = 0;
      }
      else {
        _Var1 = skip_string(&end,end_00,"slice");
        if (_Var1) {
          *(undefined4 *)((long)&value->data + 4) = 1;
        }
      }
    }
    _Var1 = skip_ws(&end,end_00);
    element_local._7_1_ = (_Bool)((_Var1 ^ 0xffU) & 1);
  }
  return element_local._7_1_;
}

Assistant:

static bool parse_view_position(const element_t* element, int id, view_position_t* position)
{
    const string_t* value = find_attribute(element, id, false);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(skip_string(&it, end, "none"))
        position->align = view_align_none;
    else if(skip_string(&it, end, "xMinYMin"))
        position->align = view_align_x_min_y_min;
    else if(skip_string(&it, end, "xMidYMin"))
        position->align = view_align_x_mid_y_min;
    else if(skip_string(&it, end, "xMaxYMin"))
        position->align = view_align_x_max_y_min;
    else if(skip_string(&it, end, "xMinYMid"))
        position->align = view_align_x_min_y_mid;
    else if(skip_string(&it, end, "xMidYMid"))
        position->align = view_align_x_mid_y_mid;
    else if(skip_string(&it, end, "xMaxYMid"))
        position->align = view_align_x_max_y_mid;
    else if(skip_string(&it, end, "xMinYMax"))
        position->align = view_align_x_min_y_max;
    else if(skip_string(&it, end, "xMidYMax"))
        position->align = view_align_x_mid_y_max;
    else if(skip_string(&it, end, "xMaxYMax"))
        position->align = view_align_x_max_y_max;
    else
        return false;
    position->scale = view_scale_meet;
    if(position->align != view_align_none) {
        skip_ws(&it, end);
        if(skip_string(&it, end, "meet"))
            position->scale = view_scale_meet;
        else if(skip_string(&it, end, "slice")) {
            position->scale = view_scale_slice;
        }
    }

    return !skip_ws(&it, end);
}